

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O2

CURL * curl_easy_duphandle(CURL *d)

{
  dynbuf *s;
  curl_mimepart *part;
  undefined1 *puVar1;
  CURLcode CVar2;
  Curl_easy *data;
  size_t length;
  char *pcVar3;
  CookieInfo *pCVar4;
  curl_slist *pcVar5;
  altsvcinfo *asi;
  hsts *h;
  long lVar6;
  
  data = (Curl_easy *)(*Curl_ccalloc)(1,0x14d8);
  if (data == (Curl_easy *)0x0) {
    return (CURL *)0x0;
  }
  (data->set).buffer_size = *(uint *)((long)d + 0x68c);
  Curl_hash_init(&data->meta_hash,0x17,Curl_hash_str,Curl_str_key_compare,dupeasy_meta_freeentry);
  s = &(data->state).headerb;
  Curl_dyn_init(s,0x19000);
  Curl_netrc_init(&(data->state).netrc);
  *(undefined4 *)&data->id = 0xffffffff;
  *(undefined4 *)((long)&data->id + 4) = 0xffffffff;
  data->mid = 0xffffffff;
  data->master_mid = 0xffffffff;
  *(undefined4 *)&(data->state).lastconnect_id = 0xffffffff;
  *(undefined4 *)((long)&(data->state).lastconnect_id + 4) = 0xffffffff;
  *(undefined4 *)&(data->state).recent_conn_id = 0xffffffff;
  *(undefined4 *)((long)&(data->state).recent_conn_id + 4) = 0xffffffff;
  Curl_llist_init(&(data->state).httphdrs,(Curl_llist_dtor)0x0);
  Curl_initinfo(data);
  memcpy(&data->set,(void *)((long)d + 400),0x8a8);
  part = &(data->set).mimepost;
  Curl_mime_initpart(part);
  memset((data->set).str,0,0x298);
  lVar6 = 0x6d8;
  do {
    if (lVar6 == 0x920) {
      lVar6 = 0x930;
      goto LAB_00125738;
    }
    CVar2 = Curl_setstropt((char **)((long)&data->magic + lVar6),*(char **)((long)d + lVar6));
    lVar6 = lVar6 + 8;
  } while (CVar2 == CURLE_OK);
  goto LAB_001257cd;
  while( true ) {
    CVar2 = Curl_setblobopt((curl_blob **)((long)&data->magic + lVar6),
                            *(curl_blob **)((long)d + lVar6));
    lVar6 = lVar6 + 8;
    if (CVar2 != CURLE_OK) break;
LAB_00125738:
    if (lVar6 == 0x970) {
      pcVar3 = *(char **)((long)d + 0x928);
      if (pcVar3 != (char *)0x0) {
        if (*(long *)((long)d + 0x1e8) == -1) {
          pcVar3 = (*Curl_cstrdup)(pcVar3);
        }
        else {
          length = curlx_sotouz(*(long *)((long)d + 0x1e8));
          pcVar3 = (char *)Curl_memdup(pcVar3,length);
        }
        (data->set).str[0x4a] = pcVar3;
        if (pcVar3 == (char *)0x0) break;
        (data->set).postfields = pcVar3;
      }
      CVar2 = Curl_mime_duppart(data,part,(curl_mimepart *)((long)d + 0x300));
      if (*(long *)((long)d + 0x4c0) != 0) {
        (data->state).resolve = (data->set).resolve;
      }
      if (CVar2 != CURLE_OK) break;
      (data->progress).flags = *(int *)((long)d + 0xacc);
      (data->progress).field_0x1ac =
           (data->progress).field_0x1ac & 0xfe | *(byte *)((long)d + 0xbfc) & 1;
      (data->state).cookielist = (curl_slist *)0x0;
      if ((*(long *)((long)d + 0xa38) != 0) && ((*(byte *)((long)d + 0x13bf) & 0x20) != 0)) {
        pCVar4 = Curl_cookie_init(data,(char *)0x0,data->cookies,
                                  (_Bool)(*(byte *)((long)d + 0xa2c) >> 7));
        data->cookies = pCVar4;
        if (pCVar4 == (CookieInfo *)0x0) break;
      }
      if (*(curl_slist **)((long)d + 0x1308) != (curl_slist *)0x0) {
        pcVar5 = Curl_slist_duplicate(*(curl_slist **)((long)d + 0x1308));
        (data->state).cookielist = pcVar5;
        if (pcVar5 == (curl_slist *)0x0) break;
      }
      if (*(char **)((long)d + 0x1228) != (char *)0x0) {
        pcVar3 = (*Curl_cstrdup)(*(char **)((long)d + 0x1228));
        (data->state).url = pcVar3;
        if (pcVar3 == (char *)0x0) break;
        puVar1 = &(data->state).field_0x7c0;
        *puVar1 = *puVar1 | 1;
      }
      if (*(char **)((long)d + 0x1230) != (char *)0x0) {
        pcVar3 = (*Curl_cstrdup)(*(char **)((long)d + 0x1230));
        (data->state).referer = pcVar3;
        if (pcVar3 == (char *)0x0) break;
        puVar1 = &(data->state).field_0x7c0;
        *puVar1 = *puVar1 | 2;
      }
      pcVar3 = (data->set).str[0x2c];
      if ((pcVar3 != (char *)0x0) && (CVar2 = Curl_ssl_set_engine(data,pcVar3), CVar2 != CURLE_OK))
      break;
      if (*(long *)((long)d + 0xa48) != 0) {
        asi = Curl_altsvc_init();
        data->asi = asi;
        if (asi == (altsvcinfo *)0x0) break;
        pcVar3 = (data->set).str[0x40];
        if (pcVar3 != (char *)0x0) {
          Curl_altsvc_load(asi,pcVar3);
        }
      }
      if (*(long *)((long)d + 0xa40) != 0) {
        h = Curl_hsts_init();
        data->hsts = h;
        if (h == (hsts *)0x0) break;
        pcVar3 = (data->set).str[0x41];
        if (pcVar3 != (char *)0x0) {
          Curl_hsts_loadfile(data,h,pcVar3);
          h = data->hsts;
        }
        Curl_hsts_loadcb(data,h);
      }
      data->magic = 0xc0dedbad;
      return data;
    }
  }
LAB_001257cd:
  (*Curl_cfree)(data->cookies);
  Curl_dyn_free(s);
  Curl_altsvc_cleanup(&data->asi);
  Curl_hsts_cleanup(&data->hsts);
  Curl_freeset(data);
  (*Curl_cfree)(data);
  return (CURL *)0x0;
}

Assistant:

CURL *curl_easy_duphandle(CURL *d)
{
  struct Curl_easy *data = d;
  struct Curl_easy *outcurl = calloc(1, sizeof(struct Curl_easy));
  if(!outcurl)
    goto fail;

  /*
   * We setup a few buffers we need. We should probably make them
   * get setup on-demand in the code, as that would probably decrease
   * the likeliness of us forgetting to init a buffer here in the future.
   */
  outcurl->set.buffer_size = data->set.buffer_size;

  Curl_hash_init(&outcurl->meta_hash, 23,
                 Curl_hash_str, Curl_str_key_compare, dupeasy_meta_freeentry);
  Curl_dyn_init(&outcurl->state.headerb, CURL_MAX_HTTP_HEADER);
  Curl_netrc_init(&outcurl->state.netrc);

  /* the connection pool is setup on demand */
  outcurl->state.lastconnect_id = -1;
  outcurl->state.recent_conn_id = -1;
  outcurl->id = -1;
  outcurl->mid = UINT_MAX;
  outcurl->master_mid = UINT_MAX;

#ifndef CURL_DISABLE_HTTP
  Curl_llist_init(&outcurl->state.httphdrs, NULL);
#endif
  Curl_initinfo(outcurl);

  /* copy all userdefined values */
  if(dupset(outcurl, data))
    goto fail;

  outcurl->progress.flags    = data->progress.flags;
  outcurl->progress.callback = data->progress.callback;

#ifndef CURL_DISABLE_COOKIES
  outcurl->state.cookielist = NULL;
  if(data->cookies && data->state.cookie_engine) {
    /* If cookies are enabled in the parent handle, we enable them
       in the clone as well! */
    outcurl->cookies = Curl_cookie_init(outcurl, NULL, outcurl->cookies,
                                        data->set.cookiesession);
    if(!outcurl->cookies)
      goto fail;
  }

  if(data->state.cookielist) {
    outcurl->state.cookielist = Curl_slist_duplicate(data->state.cookielist);
    if(!outcurl->state.cookielist)
      goto fail;
  }
#endif

  if(data->state.url) {
    outcurl->state.url = strdup(data->state.url);
    if(!outcurl->state.url)
      goto fail;
    outcurl->state.url_alloc = TRUE;
  }

  if(data->state.referer) {
    outcurl->state.referer = strdup(data->state.referer);
    if(!outcurl->state.referer)
      goto fail;
    outcurl->state.referer_alloc = TRUE;
  }

  /* Reinitialize an SSL engine for the new handle
   * note: the engine name has already been copied by dupset */
  if(outcurl->set.str[STRING_SSL_ENGINE]) {
    if(Curl_ssl_set_engine(outcurl, outcurl->set.str[STRING_SSL_ENGINE]))
      goto fail;
  }

#ifndef CURL_DISABLE_ALTSVC
  if(data->asi) {
    outcurl->asi = Curl_altsvc_init();
    if(!outcurl->asi)
      goto fail;
    if(outcurl->set.str[STRING_ALTSVC])
      (void)Curl_altsvc_load(outcurl->asi, outcurl->set.str[STRING_ALTSVC]);
  }
#endif
#ifndef CURL_DISABLE_HSTS
  if(data->hsts) {
    outcurl->hsts = Curl_hsts_init();
    if(!outcurl->hsts)
      goto fail;
    if(outcurl->set.str[STRING_HSTS])
      (void)Curl_hsts_loadfile(outcurl,
                               outcurl->hsts, outcurl->set.str[STRING_HSTS]);
    (void)Curl_hsts_loadcb(outcurl, outcurl->hsts);
  }
#endif

  outcurl->magic = CURLEASY_MAGIC_NUMBER;

  /* we reach this point and thus we are OK */

  return outcurl;

fail:

  if(outcurl) {
#ifndef CURL_DISABLE_COOKIES
    free(outcurl->cookies);
#endif
    Curl_dyn_free(&outcurl->state.headerb);
    Curl_altsvc_cleanup(&outcurl->asi);
    Curl_hsts_cleanup(&outcurl->hsts);
    Curl_freeset(outcurl);
    free(outcurl);
  }

  return NULL;
}